

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireHandWithOneCardAddCardTest_tryAddCardOnFoundationPileWithFail_Test::TestBody
          (SolitaireHandWithOneCardAddCardTest_tryAddCardOnFoundationPileWithFail_Test *this)

{
  FoundationPileMock *this_00;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  Solitaire *this_01;
  FoundationPileMock *in_RSI;
  char *message;
  AssertHelper local_90;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_88;
  AssertionResult gtest_ar;
  PileId local_4c;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_48;
  optional<solitaire::cards::Card> cardToAdd;
  
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload =
       *(_Storage<solitaire::cards::Card,_true> *)((anonymous_namespace)::oneCard._8_8_ + -8);
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_engaged = true;
  local_88.function_mocker_ =
       (FunctionMocker<void_(std::optional<solitaire::cards::Card>_&)> *)
       piles::FoundationPileMock::gmock_createSnapshot
                 ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                   *)(this->super_SolitaireHandWithOneCardAddCardTest).
                     super_SolitaireHandWithOneCardTest.super_SolitaireEmptyHandTest.
                     super_SolitaireTest.lastFoundationPileMock,in_RSI);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::InternalExpectedAt
            ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
              *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1d5,"lastFoundationPileMock","createSnapshot()");
  this_00 = (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
            super_SolitaireEmptyHandTest.super_SolitaireTest.lastFoundationPileMock;
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::Matcher
            ((Matcher<std::optional<solitaire::cards::Card>_&> *)&gtest_ar,&cardToAdd);
  piles::FoundationPileMock::gmock_tryAddCard
            (&local_88,this_00,(Matcher<std::optional<solitaire::cards::Card>_&> *)&gtest_ar);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::InternalExpectedAt
            (&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1d6,"lastFoundationPileMock","tryAddCard(cardToAdd)");
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase
            ((MatcherBase<std::optional<solitaire::cards::Card>_&> *)&local_88.matchers_);
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase
            ((MatcherBase<std::optional<solitaire::cards::Card>_&> *)&gtest_ar);
  this_01 = &(this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
             super_SolitaireEmptyHandTest.super_SolitaireTest.solitaire;
  local_4c.t = (anonymous_namespace)::lastFoundationPileId;
  Solitaire::tryAddCardOnFoundationPile(this_01,&local_4c);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
              *)&local_48,(testing *)(anonymous_namespace)::oneCard,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
              *)&local_88,(internal *)&local_48,matcher);
  Solitaire::getCardsInHand(this_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&gtest_ar,(char *)&local_88,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            ((_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &local_88);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x1d9,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.function_mocker_ !=
        (FunctionMocker<void_(std::optional<solitaire::cards::Card>_&)> *)0x0) {
      (*(code *)(((FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                   *)((local_88.function_mocker_)->super_UntypedFunctionMockerBase).
                     _vptr_UntypedFunctionMockerBase)->super_UntypedFunctionMockerBase).mock_obj_)()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardAddCardTest, tryAddCardOnFoundationPileWithFail) {
    std::optional<Card> cardToAdd {oneCard.back()};

    EXPECT_CALL(lastFoundationPileMock, createSnapshot());
    EXPECT_CALL(lastFoundationPileMock, tryAddCard(cardToAdd));

    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(oneCard));
}